

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_math.c
# Opt level: O1

t_int * sigwrap_perform(t_int *w)

{
  t_int tVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  uint uVar5;
  float fVar6;
  
  tVar1 = w[3];
  if ((int)tVar1 != 0) {
    lVar2 = w[1];
    lVar3 = w[2];
    lVar4 = 0;
    do {
      fVar6 = *(float *)(lVar2 + lVar4 * 4);
      fVar6 = (float)(~-(uint)(2.1474836e+09 < ABS(fVar6)) & (uint)fVar6);
      uVar5 = -(uint)(fVar6 < (float)(int)fVar6);
      *(float *)(lVar3 + lVar4 * 4) =
           fVar6 - (float)(~uVar5 & (uint)(float)(int)fVar6 | (uint)(float)((int)fVar6 + -1) & uVar5
                          );
      lVar4 = lVar4 + 1;
    } while ((int)tVar1 != (int)lVar4);
  }
  return w + 4;
}

Assistant:

static t_int *sigwrap_perform(t_int *w)
{
    t_sample *in = (t_sample *)w[1], *out = (t_sample *)w[2];
    int n = (int)w[3];
    while (n--)
    {
        int k;
        t_sample f = *in++;
        f = (f>INT_MAX || f<INT_MIN)?0.:f;
        k = (int)f;
        if (k <= f) *out++ = f-k;
        else *out++ = f - (k-1);
    }
    return (w + 4);
}